

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx::forward
          (Yolov3DetectionOutput_x86_avx *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  ulong uVar2;
  pointer pMVar3;
  _func_int *p_Var4;
  _func_int *p_Var5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  iterator __position;
  Mat *this_01;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined8 uVar11;
  undefined8 uVar12;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar13;
  int iVar14;
  float *pfVar15;
  undefined4 *puVar16;
  long lVar17;
  undefined4 uVar18;
  int iVar19;
  BBoxRect *__args;
  int iVar20;
  float *pfVar21;
  long lVar22;
  float *pfVar23;
  uint _h;
  ulong uVar24;
  float fVar25;
  float fVar26;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [64];
  float fVar45;
  float fVar46;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar47;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 in_register_00001384 [12];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_198;
  long local_180;
  BBoxRect local_178;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_158;
  undefined1 local_138 [16];
  ulong local_120;
  pointer local_118;
  long local_110;
  float *local_108;
  float *local_100;
  float *local_f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_f0;
  Option *local_e8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e0;
  long local_d8;
  long local_d0;
  void *local_c8;
  long local_c0;
  void *local_b8;
  long local_b0;
  long local_a8;
  float *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = top_blobs;
  local_e8 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar24 = 0;
    local_e0 = bottom_blobs;
    do {
      pvVar13 = local_e0;
      local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
      local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_198,
               (long)*(int *)(&this->field_0xd4 +
                             (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]));
      pMVar3 = (pvVar13->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      p_Var4 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
      iVar14 = pMVar3[uVar24].c / *(int *)(&this->field_0xd4 + (long)p_Var4);
      if (iVar14 != *(int *)(&this->field_0xd0 + (long)p_Var4) + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_198);
        iVar14 = -1;
        goto LAB_004602a1;
      }
      p_Var5 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
      local_120 = uVar24;
      if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
        local_118 = pMVar3 + uVar24;
        uVar2._0_4_ = local_118->w;
        uVar2._4_4_ = local_118->h;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar2;
        auVar40 = vcvtdq2ps_avx(auVar27);
        fVar25 = *(float *)(*(long *)(&this->field_0x170 + (long)p_Var4) + uVar24 * 4);
        uVar18 = vextractps_avx(auVar27,1);
        local_110 = CONCAT44((int)((ulong)*(long *)(&this->field_0x170 + (long)p_Var4) >> 0x20),
                             uVar18);
        auVar39._0_4_ = fVar25 * auVar40._0_4_;
        auVar39._4_4_ = fVar25 * auVar40._4_4_;
        auVar39._8_4_ = fVar25 * auVar40._8_4_;
        auVar39._12_4_ = fVar25 * auVar40._12_4_;
        lVar17 = CONCAT44((int)(uVar24 * 9 >> 0x20),(undefined4)uVar2);
        local_98 = vroundps_avx(auVar39,0xb);
        local_d8 = (long)iVar14;
        auVar28._0_12_ = ZEXT412(0x3f000000) << 0x40;
        auVar28._12_4_ = 0x3f000000;
        local_78 = auVar40._0_8_;
        register0x00001248 = auVar28._8_8_;
        auVar27 = vrcpps_avx(_local_78);
        fVar25 = auVar27._0_4_;
        auVar35._0_4_ = auVar40._0_4_ * fVar25;
        fVar26 = auVar27._4_4_;
        auVar35._4_4_ = auVar40._4_4_ * fVar26;
        fVar45 = auVar27._8_4_;
        auVar35._8_4_ = fVar45 * 0.5;
        fVar46 = auVar27._12_4_;
        auVar35._12_4_ = fVar46 * 0.5;
        auVar40._8_4_ = 0x3f800000;
        auVar40._0_8_ = 0x3f8000003f800000;
        auVar40._12_4_ = 0x3f800000;
        auVar40 = vsubps_avx(auVar40,auVar35);
        local_88._0_4_ = fVar25 + fVar25 * auVar40._0_4_;
        local_88._4_4_ = fVar26 + fVar26 * auVar40._4_4_;
        fStack_80 = fVar45 + fVar45 * auVar40._8_4_;
        fStack_7c = fVar46 + fVar46 * auVar40._12_4_;
        local_d0 = (long)*(int *)(&this->field_0xd4 + (long)p_Var4) * uVar24 * 4;
        local_180 = 0;
        local_b0 = lVar17;
        do {
          uVar24 = local_118->elemsize;
          if (0 < (int)local_110) {
            lVar22 = local_180 * local_d8;
            local_c8 = (void *)((lVar22 + 5) * local_118->cstep * uVar24 + (long)local_118->data);
            auVar29._8_8_ = 0;
            auVar29._0_8_ =
                 *(ulong *)(*(long *)(&this->field_0xe0 + (long)p_Var5) +
                           (long)((int)*(float *)(*(long *)(&this->field_0x128 + (long)p_Var5) +
                                                  local_d0 + local_180 * 4) * 2) * 4);
            sVar6 = local_118->cstep;
            pvVar7 = local_118->data;
            sVar8 = local_118->elemsize;
            pfVar21 = (float *)((lVar22 + 4) * sVar6 * sVar8 + (long)pvVar7);
            local_f8 = (float *)((lVar22 + 3) * sVar6 * sVar8 + (long)pvVar7);
            local_100 = (float *)((lVar22 + 2) * sVar6 * sVar8 + (long)pvVar7);
            local_108 = (float *)((lVar22 + 1) * sVar6 * sVar8 + (long)pvVar7);
            pfVar23 = (float *)(lVar22 * sVar6 * sVar8 + (long)pvVar7);
            iVar14 = (int)(((long)local_118->d * uVar24 * (long)local_118->h * (long)local_118->w +
                            0xf & 0xfffffffffffffff0) / uVar24);
            auVar36._8_4_ = 0x3f800000;
            auVar36._0_8_ = 0x3f8000003f800000;
            auVar36._12_4_ = 0x3f800000;
            local_68 = vmovlhps_avx(auVar36,auVar29);
            local_a8 = (long)iVar14;
            lVar22 = 0;
            do {
              local_c0 = lVar22;
              if (0 < (int)lVar17) {
                auVar30._0_4_ = (float)(int)lVar22;
                auVar30._4_12_ = in_register_00001384;
                local_b8 = (void *)((long)local_c8 + lVar22 * lVar17 * 4);
                local_58 = vshufps_avx(auVar30,local_98,0x40);
                lVar22 = 0;
                do {
                  p_Var4 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
                  lVar17 = *(int *)(&this->field_0xd0 + (long)p_Var4) * local_a8;
                  if ((int)lVar17 < 1) {
                    iVar20 = 0;
                    local_138 = SUB6416(ZEXT464(0xff7fffff),0);
                  }
                  else {
                    pfVar15 = (float *)((long)local_b8 + lVar22 * 4);
                    pfVar1 = pfVar15 + lVar17;
                    iVar20 = 0;
                    auVar38 = ZEXT464(0xff7fffff);
                    iVar19 = 0;
                    do {
                      if (auVar38._0_4_ < *pfVar15) {
                        iVar20 = iVar19;
                      }
                      local_138 = vmaxss_avx(ZEXT416((uint)*pfVar15),auVar38._0_16_);
                      auVar38 = ZEXT1664(local_138);
                      pfVar15 = pfVar15 + iVar14;
                      iVar19 = iVar19 + 1;
                    } while (pfVar15 < pfVar1);
                  }
                  local_a0 = pfVar23;
                  fVar25 = expf(-*pfVar21);
                  fVar26 = expf(-(float)local_138._0_4_);
                  pfVar23 = local_a0;
                  fVar25 = 1.0 / ((fVar26 + 1.0) * fVar25 + 1.0);
                  if (*(float *)(&this->field_0xd8 + (long)p_Var4) <= fVar25) {
                    fVar26 = expf(-*local_a0);
                    local_138 = ZEXT416((uint)(fVar26 + 1.0));
                    fVar26 = expf(-*local_108);
                    local_48 = vinsertps_avx(local_138,ZEXT416((uint)(fVar26 + 1.0)),0x10);
                    local_138._0_4_ = expf(*local_100);
                    local_138._4_4_ = extraout_XMM0_Db;
                    local_138._8_4_ = extraout_XMM0_Dc;
                    local_138._12_4_ = extraout_XMM0_Dd;
                    auVar38._0_4_ = expf(*local_f8);
                    auVar38._4_60_ = extraout_var;
                    auVar27 = vrcpps_avx(local_48);
                    fVar26 = local_68._0_4_ * auVar27._0_4_;
                    fVar45 = local_68._4_4_ * auVar27._4_4_;
                    fVar46 = local_68._8_4_ * auVar27._8_4_;
                    fVar47 = local_68._12_4_ * auVar27._12_4_;
                    auVar48._0_4_ = local_48._0_4_ * fVar26;
                    auVar48._4_4_ = local_48._4_4_ * fVar45;
                    auVar48._8_4_ = local_48._8_4_ * fVar46;
                    auVar48._12_4_ = local_48._12_4_ * fVar47;
                    auVar28 = vsubps_avx(local_68,auVar48);
                    fVar26 = fVar26 + auVar27._0_4_ * auVar28._0_4_;
                    fVar45 = fVar45 + auVar27._4_4_ * auVar28._4_4_;
                    auVar32._4_4_ = fVar45;
                    auVar32._0_4_ = fVar26;
                    auVar41._8_8_ = local_138._0_8_;
                    auVar41._0_8_ = local_138._0_8_;
                    auVar40 = vinsertps_avx(auVar41,auVar38._0_16_,0x30);
                    auVar9._4_8_ = auVar40._8_8_;
                    auVar9._0_4_ = local_68._4_4_ * auVar40._4_4_;
                    auVar31._0_8_ = auVar9._0_8_ << 0x20;
                    auVar31._8_4_ = local_68._8_4_ * auVar40._8_4_;
                    auVar31._12_4_ = local_68._12_4_ * auVar40._12_4_;
                    auVar42._0_4_ = (float)(int)lVar22;
                    auVar42._4_12_ = local_58._4_12_;
                    auVar32._8_8_ = auVar31._8_8_;
                    auVar40 = vrcpps_avx(auVar42);
                    fVar49 = fVar26 * auVar40._0_4_;
                    fVar50 = fVar45 * auVar40._4_4_;
                    fVar51 = auVar31._8_4_ * auVar40._8_4_;
                    fVar52 = auVar31._12_4_ * auVar40._12_4_;
                    auVar53._0_4_ = auVar42._0_4_ * fVar49;
                    auVar53._4_4_ = local_58._4_4_ * fVar50;
                    auVar53._8_4_ = local_58._8_4_ * fVar51;
                    auVar53._12_4_ = local_58._12_4_ * fVar52;
                    auVar35 = vsubps_avx(auVar32,auVar53);
                    auVar33._0_4_ = fVar49 + auVar40._0_4_ * auVar35._0_4_;
                    auVar33._4_4_ = fVar50 + auVar40._4_4_ * auVar35._4_4_;
                    auVar33._8_4_ = fVar51 + auVar40._8_4_ * auVar35._8_4_;
                    auVar33._12_4_ = fVar52 + auVar40._12_4_ * auVar35._12_4_;
                    auVar37._0_4_ = (fVar26 + auVar42._0_4_) * (float)local_88._0_4_;
                    auVar37._4_4_ = (fVar45 + local_58._4_4_) * (float)local_88._4_4_;
                    auVar37._8_4_ =
                         (fVar46 + auVar27._8_4_ * auVar28._8_4_ + local_58._8_4_) * fStack_80;
                    auVar37._12_4_ =
                         (fVar47 + auVar27._12_4_ * auVar28._12_4_ + local_58._12_4_) * fStack_7c;
                    auVar43._0_4_ = auVar33._0_4_ * (float)local_78._0_4_;
                    auVar43._4_4_ = auVar33._4_4_ * (float)local_78._4_4_;
                    auVar43._8_4_ = auVar33._8_4_ * fStack_70;
                    auVar43._12_4_ = auVar33._12_4_ * fStack_6c;
                    auVar40 = vshufpd_avx(auVar43,auVar37,1);
                    auVar27 = vsubps_avx(auVar37,auVar40);
                    auVar10._4_8_ = auVar43._8_8_;
                    auVar10._0_4_ = auVar43._4_4_ + auVar40._4_4_;
                    auVar44._0_8_ = auVar10._0_8_ << 0x20;
                    auVar44._8_4_ = auVar43._8_4_ + auVar40._8_4_;
                    auVar44._12_4_ = auVar43._12_4_ + auVar40._12_4_;
                    auVar40 = vmovshdup_avx(auVar33);
                    auVar34._0_4_ = auVar40._0_4_ * auVar33._0_4_;
                    auVar34._4_4_ = auVar40._4_4_ * auVar33._4_4_;
                    auVar34._8_4_ = auVar40._8_4_ * auVar33._8_4_;
                    auVar34._12_4_ = auVar40._12_4_ * auVar33._12_4_;
                    local_178.xmin = auVar27._0_4_;
                    local_178.ymin = auVar27._4_4_;
                    local_178.area = (float)vextractps_avx(auVar34,2);
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_198.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_180);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_178.score = fVar25;
                    local_178.xmax = auVar44._8_4_;
                    local_178.ymax = auVar44._12_4_;
                    local_178.label = iVar20;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_178);
                    }
                    else {
                      (__position._M_current)->xmax = (float)(int)auVar44._8_8_;
                      (__position._M_current)->ymax = (float)(int)((ulong)auVar44._8_8_ >> 0x20);
                      (__position._M_current)->area = local_178.area;
                      (__position._M_current)->label = iVar20;
                      (__position._M_current)->score = fVar25;
                      (__position._M_current)->xmin = local_178.xmin;
                      (__position._M_current)->ymin = local_178.ymin;
                      (__position._M_current)->xmax = auVar44._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                    }
                  }
                  pfVar23 = pfVar23 + 1;
                  local_108 = local_108 + 1;
                  local_100 = local_100 + 1;
                  local_f8 = local_f8 + 1;
                  pfVar21 = pfVar21 + 1;
                  lVar22 = lVar22 + 1;
                  lVar17 = local_b0;
                } while (lVar22 != local_b0);
              }
              lVar22 = local_c0 + 1;
            } while (lVar22 != local_110);
          }
          local_180 = local_180 + 1;
          p_Var5 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
        } while (local_180 < *(int *)(&this->field_0xd4 + (long)p_Var5));
      }
      uVar24 = local_120;
      if (0 < *(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3])) {
        lVar17 = 8;
        lVar22 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_158,
                     local_158.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_198.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8),
                     *(undefined8 *)
                      ((long)&((local_198.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar17));
          lVar22 = lVar22 + 1;
          lVar17 = lVar17 + 0x18;
        } while (lVar22 < *(int *)(&this->field_0xd4 +
                                  (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]));
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_198);
      uVar24 = uVar24 + 1;
    } while (uVar24 < (ulong)(((long)(local_e0->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_e0->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]),&local_158);
  local_178.score = 0.0;
  local_178.xmin = 0.0;
  local_178.ymin = 0.0;
  local_178.xmax = 0.0;
  local_178.ymax = 0.0;
  local_178.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]),&local_158,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178,
             *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]));
  local_198.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_198.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar17 = CONCAT44(local_178.xmin,local_178.score);
  if (CONCAT44(local_178.xmax,local_178.ymin) != lVar17) {
    uVar24 = 0;
    do {
      __args = local_158.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar17 + uVar24 * 8);
      if (local_198.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_198.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_198,
                   (iterator)
                   local_198.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        uVar11 = *(undefined8 *)__args;
        uVar12 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_198.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_198.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar11;
        *(undefined8 *)
         ((long)local_198.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar12;
        local_198.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_198.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar24 = uVar24 + 1;
      lVar17 = CONCAT44(local_178.xmin,local_178.score);
    } while (uVar24 < (ulong)(CONCAT44(local_178.xmax,local_178.ymin) - lVar17 >> 3));
  }
  _h = (int)((long)local_198.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_198.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
  iVar14 = 0;
  if (_h != 0) {
    this_01 = (local_f0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_01,6,_h,4,local_e8->blob_allocator);
    iVar14 = -100;
    if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
       (iVar14 = 0, 0 < (int)_h)) {
      iVar20 = this_01->w;
      sVar6 = this_01->elemsize;
      puVar16 = (undefined4 *)((long)this_01->data + 0x14);
      iVar14 = 0;
      lVar17 = 0;
      do {
        uVar18 = *(undefined4 *)
                  ((long)&((local_198.
                            super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar17);
        puVar16[-5] = (float)*(int *)((long)&local_198.
                                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].
                                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar17) +
                      1.0;
        puVar16[-4] = uVar18;
        puVar16[-3] = *(undefined4 *)
                       ((long)&((local_198.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar17 + 4);
        puVar16[-2] = *(undefined4 *)
                       ((long)&((local_198.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar17);
        puVar16[-1] = *(undefined4 *)
                       ((long)&((local_198.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar17 + 4);
        *puVar16 = *(undefined4 *)
                    ((long)&((local_198.
                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar17);
        lVar17 = lVar17 + 0x1c;
        puVar16 = (undefined4 *)((long)puVar16 + (long)iVar20 * sVar6);
      } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar17);
    }
  }
  if (local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar7 = (void *)CONCAT44(local_178.xmin,local_178.score);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,CONCAT44(local_178.area,local_178.ymax) - (long)pvVar7);
  }
LAB_004602a1:
  if (local_158.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar14;
}

Assistant:

int Yolov3DetectionOutput_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = (int)scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}